

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_26382a::DirectoryContentsTask::start
          (DirectoryContentsTask *this,TaskInterface ti)

{
  BuildKey *this_00;
  char *pcVar1;
  StringRef path;
  BuildKey local_70;
  KeyType local_50;
  DirectoryContentsTask *local_30;
  DirectoryContentsTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (DirectoryContentsTask *)ti.impl;
  ti_local.ctx = &this->path;
  local_30 = this;
  this_00 = (BuildKey *)std::__cxx11::string::data();
  pcVar1 = (char *)std::__cxx11::string::length();
  path.Length = (size_t)pcVar1;
  path.Data = pcVar1;
  llbuild::buildsystem::BuildKey::makeNode(&local_70,this_00,path);
  llbuild::buildsystem::BuildKey::toData(&local_50,&local_70);
  llbuild::core::TaskInterface::request((TaskInterface *)&this_local,&local_50,0);
  llbuild::core::KeyType::~KeyType(&local_50);
  llbuild::buildsystem::BuildKey::~BuildKey(&local_70);
  return;
}

Assistant:

virtual void start(TaskInterface ti) override {
    // Request the base directory node -- this task doesn't actually use the
    // value, but this connects the task to its producer if present.

    // FIXME:
    //
    //engine.taskMustFollow(this, BuildKey::makeNode(path).toData());
    //
    // The taskMustFollow method expresses the weak dependency we have on
    // 'path', but only at the task level. What we really want is to say at the
    // 'isResultValid'/scanning level is 'must scan after'. That way we hold up
    // this and downstream rules until the 'path' node has been set into its
    // final state*.
    //
    // With the explicit dependency we are establishing with request(), we
    // will unfortunately mark directory contents as 'needs to be built' under
    // situations where non-releveant stat info has changed. This causes
    // unnecessary rebuilds. See rdar://problem/30640904
    //
    // * The 'final state' of a directory is also a thorny patch of toxic land
    // mines. We really want directory contents to weakly depend upon anything
    // that is currently and/or may be altered within it. i.e. if one rule
    // creates the directory and another rule writes a file into it, we want to
    // defer scanning until both of them have been scanned and possibly run.
    // Having a 'must scan after' would help with the first rule (mkdir), but
    // not the second, in particular if rules are added in subsequent builds.
    // Related rdar://problem/30638921
    //
    ti.request(BuildKey::makeNode(path).toData(), /*inputID=*/0);
  }